

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O0

void set_params_for_leaf_frames
               (TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,PRIMARY_RATE_CONTROL *p_rc,
               FRAME_INFO *frame_info,GF_GROUP *gf_group,int *cur_frame_idx,int *frame_ind,
               int *parallel_frame_count,int max_parallel_frames,int do_frame_parallel_encode,
               int *first_frame_index,int *cur_disp_index,int layer_depth,int start,int end)

{
  int iVar1;
  GF_GROUP *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000094;
  undefined4 in_stack_0000009c;
  undefined4 in_stack_000000a4;
  TWO_PASS_FRAME *in_stack_000000a8;
  TWO_PASS *in_stack_000000b0;
  int in_stack_000000c0;
  int *in_stack_000000c8;
  int *in_stack_000000d0;
  int in_stack_000000d8;
  int local_34;
  
  in_R8->update_type[*in_stack_00000008] = '\x01';
  in_R8->arf_src_offset[*in_stack_00000008] = '\0';
  in_R8->cur_frame_idx[*in_stack_00000008] = (uchar)*in_R9;
  in_R8->layer_depth[*in_stack_00000008] = 6;
  in_R8->frame_type[*in_stack_00000008] = '\x01';
  in_R8->refbuf_state[*in_stack_00000008] = '\x01';
  if ((int)frame_info < in_R8->max_layer_depth) {
    local_34 = in_R8->max_layer_depth;
  }
  else {
    local_34 = (int)frame_info;
  }
  in_R8->max_layer_depth = local_34;
  in_R8->display_idx[*in_stack_00000008] = *(int *)gf_group->update_type;
  iVar1 = av1_calc_arf_boost(in_stack_000000b0,in_stack_000000a8,
                             (PRIMARY_RATE_CONTROL *)CONCAT44(in_stack_000000a4,end),
                             (FRAME_INFO *)CONCAT44(in_stack_0000009c,start),in_stack_00000094,
                             layer_depth,in_stack_000000c0,in_stack_000000c8,in_stack_000000d0,
                             in_stack_000000d8);
  in_R8->arf_boost[*in_stack_00000008] = iVar1;
  *(int *)gf_group->update_type = *(int *)gf_group->update_type + 1;
  if (in_stack_00000020 != 0) {
    set_frame_parallel_level
              (in_R8->frame_parallel_level + *in_stack_00000008,in_stack_00000010,in_stack_00000018)
    ;
    in_R8->is_frame_non_ref[*in_stack_00000008] = true;
  }
  set_src_offset(in_R8,cur_frame_idx,*in_R9,*in_stack_00000008);
  *in_stack_00000008 = *in_stack_00000008 + 1;
  *in_R9 = *in_R9 + 1;
  return;
}

Assistant:

static inline void set_params_for_leaf_frames(
    const TWO_PASS *twopass, const TWO_PASS_FRAME *twopass_frame,
    const PRIMARY_RATE_CONTROL *p_rc, FRAME_INFO *frame_info,
    GF_GROUP *const gf_group, int *cur_frame_idx, int *frame_ind,
    int *parallel_frame_count, int max_parallel_frames,
    int do_frame_parallel_encode, int *first_frame_index, int *cur_disp_index,
    int layer_depth, int start, int end) {
  gf_group->update_type[*frame_ind] = LF_UPDATE;
  gf_group->arf_src_offset[*frame_ind] = 0;
  gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
  gf_group->layer_depth[*frame_ind] = MAX_ARF_LAYERS;
  gf_group->frame_type[*frame_ind] = INTER_FRAME;
  gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;
  gf_group->max_layer_depth = AOMMAX(gf_group->max_layer_depth, layer_depth);
  gf_group->display_idx[*frame_ind] = (*cur_disp_index);
  gf_group->arf_boost[*frame_ind] =
      av1_calc_arf_boost(twopass, twopass_frame, p_rc, frame_info, start,
                         end - start, 0, NULL, NULL, 0);
  ++(*cur_disp_index);

  // Set the level of parallelism for the LF_UPDATE frame.
  if (do_frame_parallel_encode) {
    set_frame_parallel_level(&gf_group->frame_parallel_level[*frame_ind],
                             parallel_frame_count, max_parallel_frames);
    // Set LF_UPDATE frames as non-reference frames.
    gf_group->is_frame_non_ref[*frame_ind] = true;
  }
  set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);

  ++(*frame_ind);
  ++(*cur_frame_idx);
}